

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

void __thiscall
QAccessibleTableCell::QAccessibleTableCell
          (QAccessibleTableCell *this,QAbstractItemView *view_,QModelIndex *index_,Role role_)

{
  Data *pDVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_48;
  Stream *local_40;
  undefined1 local_38 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_30;
  
  local_30.ptr = *(QAbstractItemModel **)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QAccessibleTableCell_0080a4d8;
  *(undefined ***)&this->super_QAccessibleTableCellInterface = &PTR__QAccessibleTableCell_0080a5e8;
  *(undefined ***)&this->super_QAccessibleActionInterface = &PTR__QAccessibleTableCell_0080a648;
  if (view_ == (QAbstractItemView *)0x0) {
    pDVar1 = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)view_);
  }
  (this->view).wp.d = pDVar1;
  (this->view).wp.value = (QObject *)view_;
  QPersistentModelIndex::QPersistentModelIndex(&this->m_index,index_);
  this->m_role = role_;
  if (((index_->r < 0) || (index_->c < 0)) || ((index_->m).ptr == (QAbstractItemModel *)0x0)) {
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_48,
                                "QAccessibleTableCell::QAccessibleTableCell with invalid index: ");
    local_40 = pQVar2->stream;
    *(int *)(local_40 + 0x28) = *(int *)(local_40 + 0x28) + 1;
    ::operator<<((Stream *)local_38,(QModelIndex *)&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
  }
  if (*(QAbstractItemModel **)(in_FS_OFFSET + 0x28) == local_30.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTableCell::QAccessibleTableCell(QAbstractItemView *view_, const QModelIndex &index_, QAccessible::Role role_)
    : /* QAccessibleSimpleEditableTextInterface(this), */ view(view_), m_index(index_), m_role(role_)
{
    if (Q_UNLIKELY(!index_.isValid()))
        qWarning() << "QAccessibleTableCell::QAccessibleTableCell with invalid index: " << index_;
}